

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.cc
# Opt level: O2

void __thiscall
google::protobuf::io::CodedOutputStream::CodedOutputStream
          (CodedOutputStream *this,ZeroCopyOutputStream *stream,bool do_eager_refresh)

{
  uint8_t *puVar1;
  byte bVar2;
  int iVar3;
  undefined4 extraout_var;
  uint8_t *ptr;
  undefined7 in_register_00000011;
  uint8_t *puVar4;
  void *data;
  int size;
  uint8_t *local_38;
  uint local_2c;
  
  bVar2 = default_serialization_deterministic_;
  puVar4 = (this->impl_).buffer_;
  (this->impl_).end_ = puVar4;
  (this->impl_).buffer_end_ = puVar4;
  (this->impl_).stream_ = stream;
  (this->impl_).had_error_ = false;
  (this->impl_).aliasing_enabled_ = false;
  (this->impl_).is_serialization_deterministic_ = (bool)(bVar2 & 1);
  this->cur_ = puVar4;
  iVar3 = (*stream->_vptr_ZeroCopyOutputStream[4])(stream);
  this->start_count_ = CONCAT44(extraout_var,iVar3);
  if (((int)CONCAT71(in_register_00000011,do_eager_refresh) != 0) &&
     (iVar3 = (*stream->_vptr_ZeroCopyOutputStream[2])(stream,&local_38,&local_2c),
     (local_2c != 0 & (byte)iVar3) == 1)) {
    puVar1 = puVar4 + (int)local_2c;
    if (0x10 < (int)local_2c) {
      puVar4 = local_38;
      puVar1 = local_38 + ((ulong)local_2c - 0x10);
      local_38 = (uint8_t *)0x0;
    }
    (this->impl_).end_ = puVar1;
    (this->impl_).buffer_end_ = local_38;
    this->cur_ = puVar4;
  }
  return;
}

Assistant:

CodedOutputStream::CodedOutputStream(ZeroCopyOutputStream* stream,
                                     bool do_eager_refresh)
    : impl_(stream, IsDefaultSerializationDeterministic(), &cur_),
      start_count_(stream->ByteCount()) {
  if (do_eager_refresh) {
    void* data;
    int size;
    if (!stream->Next(&data, &size) || size == 0) return;
    cur_ = impl_.SetInitialBuffer(data, size);
  }
}